

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

size_t __thiscall slang::ast::Type::hash(Type *this)

{
  SymbolKind SVar1;
  int rest;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  Type *pTVar9;
  ulong uVar10;
  size_t sVar11;
  IntegralType *it;
  long lVar12;
  ulong uVar13;
  ulong local_40;
  size_t local_38;
  
  uVar13 = (ulong)(int)(this->super_Symbol).kind;
  pTVar9 = this->canonical;
  local_40 = uVar13;
  if (pTVar9 == (Type *)0x0) {
    this->canonical = this;
    pTVar9 = this;
    do {
      pTVar9 = DeclaredType::getType((DeclaredType *)(pTVar9 + 1));
      this->canonical = pTVar9;
    } while ((pTVar9->super_Symbol).kind == TypeAlias);
  }
  bVar8 = isScalar(pTVar9);
  if (bVar8) {
    SVar1 = (SymbolKind)pTVar9[1].super_Symbol.name._M_len;
    uVar10 = 1;
LAB_00395eea:
    if (SVar1 != Definition) {
      uVar10 = (ulong)SVar1;
    }
LAB_00395eed:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    local_40 = (uVar13 >> 2) + uVar13 * 0x40 + 0x9e3779b9 +
               (SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar2 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar13;
  }
  else {
    bVar8 = isFloating(pTVar9);
    if (bVar8) {
      SVar1 = pTVar9[1].super_Symbol.kind;
      uVar10 = 0;
      goto LAB_00395eea;
    }
    bVar8 = isIntegral(pTVar9);
    if (bVar8) {
      uVar13 = (uVar13 >> 2) + uVar13 * 0x40 + 0x9e3779b9 +
               (ulong)(byte)pTVar9[1].super_Symbol.field_0x4 * -0x61c8864680b583eb ^ uVar13;
      lVar12 = -0x61c88645e27e0a32;
      if (pTVar9[1].super_Symbol.field_0x5 == '\0') {
        lVar12 = 0x9e3779b9;
      }
      uVar13 = (uVar13 >> 2) + uVar13 * 0x40 + lVar12 ^ uVar13;
      auVar7 = ZEXT416(pTVar9[1].super_Symbol.kind) * ZEXT816(0x9e3779b97f4a7c15);
      uVar10 = (uVar13 >> 2) + 0x9e3779b9 + uVar13 * 0x40 + (auVar7._8_8_ ^ auVar7._0_8_);
LAB_00395fbf:
      return uVar10 ^ uVar13;
    }
    SVar1 = (pTVar9->super_Symbol).kind;
    switch(SVar1) {
    case FixedSizeUnpackedArrayType:
      rest = *(int *)((long)&pTVar9[1].super_Symbol.name._M_len + 4);
      sVar11 = hash(*(Type **)&pTVar9[1].super_Symbol);
      hash_combine<int,int,unsigned_long>(&local_40,(int *)&pTVar9[1].super_Symbol.name,rest,sVar11)
      ;
      break;
    case DynamicArrayType:
      uVar10 = hash(*(Type **)&pTVar9[1].super_Symbol);
      goto LAB_00395eed;
    case DPIOpenArrayType:
      sVar11 = hash(*(Type **)&pTVar9[1].super_Symbol);
      hash_combine<bool,unsigned_long>(&local_40,(bool *)&pTVar9[1].super_Symbol.name,sVar11);
      break;
    case AssociativeArrayType:
      sVar11 = hash(*(Type **)&pTVar9[1].super_Symbol);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = sVar11;
      uVar13 = (uVar13 >> 2) + uVar13 * 0x40 + 0x9e3779b9 +
               (SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar3 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar13;
      pTVar9 = (Type *)pTVar9[1].super_Symbol.name._M_len;
      local_40 = uVar13;
      if (pTVar9 != (Type *)0x0) {
        sVar11 = hash(pTVar9);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = sVar11;
        local_40 = uVar13 * 0x40 + 0x9e3779b9 +
                   (uVar13 >> 2) +
                   (SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0)) ^ uVar13;
      }
      break;
    case QueueType:
      local_38 = hash(*(Type **)&pTVar9[1].super_Symbol);
      hash_combine<unsigned_long,unsigned_int>
                (&local_40,&local_38,(uint)pTVar9[1].super_Symbol.name._M_len);
      break;
    default:
      if (SVar1 != VirtualInterfaceType) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = pTVar9;
        return SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)&pTVar9[1].super_Symbol;
      uVar13 = (uVar13 >> 2) + uVar13 * 0x40 + 0x9e3779b9 +
               (SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar5,8) ^
               SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar5,0)) ^ uVar13;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = pTVar9[1].super_Symbol.name._M_len;
      uVar10 = (SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar6,8) ^
               SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar6,0)) + 0x9e3779b9 +
               (uVar13 >> 2) + uVar13 * 0x40;
      goto LAB_00395fbf;
    }
  }
  return local_40;
}

Assistant:

size_t Type::hash() const {
    size_t h = size_t(kind);
    auto& ct = getCanonicalType();
    if (ct.isScalar()) {
        auto sk = ct.as<ScalarType>().scalarKind;
        if (sk == ScalarType::Reg)
            sk = ScalarType::Logic;
        hash_combine(h, sk);
    }
    else if (ct.isFloating()) {
        auto fk = ct.as<FloatingType>().floatKind;
        if (fk == FloatingType::RealTime)
            fk = FloatingType::Real;
        hash_combine(h, fk);
    }
    else if (ct.isIntegral()) {
        auto& it = ct.as<IntegralType>();
        hash_combine(h, it.isSigned, it.isFourState, it.bitWidth);
    }
    else if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
        auto& uat = ct.as<FixedSizeUnpackedArrayType>();
        hash_combine(h, uat.range.left, uat.range.right, uat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::DynamicArrayType) {
        auto& dat = ct.as<DynamicArrayType>();
        hash_combine(h, dat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::DPIOpenArrayType) {
        auto& dat = ct.as<DPIOpenArrayType>();
        hash_combine(h, dat.isPacked, dat.elementType.hash());
    }
    else if (ct.kind == SymbolKind::AssociativeArrayType) {
        auto& aat = ct.as<AssociativeArrayType>();
        hash_combine(h, aat.elementType.hash());
        if (aat.indexType)
            hash_combine(h, aat.indexType->hash());
    }
    else if (ct.kind == SymbolKind::QueueType) {
        auto& qt = ct.as<QueueType>();
        hash_combine(h, qt.elementType.hash(), qt.maxBound);
    }
    else if (ct.kind == SymbolKind::VirtualInterfaceType) {
        auto& vi = ct.as<VirtualInterfaceType>();
        hash_combine(h, &vi.iface);
        hash_combine(h, vi.modport);
    }
    else {
        h = (size_t)slang::hash<const Type*>()(&ct);
    }
    return h;
}